

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object___getClass(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  JSAtom atom;
  JSValue JVar3;
  
  if ((int)argv->tag == -1) {
    uVar2 = (ulong)*(ushort *)((long)(argv->u).ptr + 6);
    if (uVar2 == 0x29) {
      JVar3.tag = argv->tag;
      JVar3.u.ptr = (argv->u).ptr;
      iVar1 = JS_IsFunction(ctx,JVar3);
      uVar2 = 0xd;
      if (iVar1 == 0) {
        uVar2 = 0x29;
      }
    }
    atom = ctx->rt->class_array[uVar2].class_name;
  }
  else {
    atom = 0x2f;
  }
  JVar3 = JS_AtomToString(ctx,atom);
  return JVar3;
}

Assistant:

static JSValue js_object___getClass(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSAtom atom;
    JSObject *p;
    uint32_t tag;
    int class_id;

    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(argv[0]);
        class_id = p->class_id;
        if (class_id == JS_CLASS_PROXY && JS_IsFunction(ctx, argv[0]))
            class_id = JS_CLASS_BYTECODE_FUNCTION;
        atom = ctx->rt->class_array[class_id].class_name;
    } else {
        atom = JS_ATOM_empty_string;
    }
    return JS_AtomToString(ctx, atom);
}